

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

string * __thiscall Archive::Child::getName_abi_cxx11_(string *__return_storage_ptr__,Child *this)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  size_t end;
  string local_218 [8];
  string addr;
  string local_70;
  uint local_4c;
  undefined4 local_48;
  int offset;
  undefined1 local_38 [8];
  string name;
  Child *this_local;
  
  name.field_2._8_8_ = this;
  getRawName_abi_cxx11_((string *)local_38,this);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  if (*pcVar4 == '/') {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
      local_48 = 1;
    }
    else {
      lVar5 = std::__cxx11::string::size();
      if (lVar5 == 2) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if (*pcVar4 == '/') {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
          local_48 = 1;
          goto LAB_02534fe1;
        }
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)local_38);
      uVar3 = std::__cxx11::stoi(&local_70,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_70);
      local_4c = uVar3;
      if (((int)uVar3 < 0) || ((this->parent->stringTable).len <= uVar3)) {
        ::wasm::Fatal::Fatal((Fatal *)((long)&addr.field_2 + 8));
        ::wasm::Fatal::operator<<
                  ((Fatal *)((long)&addr.field_2 + 8),
                   (char (*) [40])"Malformed archive: name parsing failed\n");
        ::wasm::Fatal::~Fatal((Fatal *)((long)&addr.field_2 + 8));
      }
      puVar2 = (this->parent->stringTable).data;
      uVar1 = (this->parent->stringTable).len;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<unsigned_char_const*,void>
                (local_218,puVar2 + (int)uVar3,puVar2 + uVar1,(allocator<char> *)((long)&end + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&end + 7));
      std::__cxx11::string::find((char)local_218,10);
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_218);
      local_48 = 1;
      std::__cxx11::string::~string(local_218);
    }
  }
  else {
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar4 == '/') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_38);
      local_48 = 1;
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
      local_48 = 1;
    }
  }
LAB_02534fe1:
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Archive::Child::getName() const {
  std::string name = getRawName();
  // Check if it's a special name.
  if (name[0] == '/') {
    if (name.size() == 1) { // Linker member.
      return name;
    }
    if (name.size() == 2 && name[1] == '/') { // String table.
      return name;
    }
    // It's a long name.
    // Get the offset.
    int offset = std::stoi(name.substr(1), nullptr, 10);

    // Verify it.
    if (offset < 0 || (unsigned)offset >= parent->stringTable.len) {
      wasm::Fatal() << "Malformed archive: name parsing failed\n";
    }

    std::string addr(parent->stringTable.data + offset,
                     parent->stringTable.data + parent->stringTable.len);

    // GNU long file names end with a "/\n".
    size_t end = addr.find('\n');
    return addr.substr(0, end - 1);
  }
  // It's a simple name.
  if (name[name.size() - 1] == '/') {
    return name.substr(0, name.size() - 1);
  }
  return name;
}